

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlSwitchEncoding(xmlParserCtxtPtr ctxt,xmlCharEncoding enc)

{
  xmlParserErrors code_00;
  xmlParserErrors code;
  int ret;
  xmlCharEncodingHandlerPtr handler;
  xmlParserCtxtPtr pxStack_18;
  xmlCharEncoding enc_local;
  xmlParserCtxtPtr ctxt_local;
  
  _code = (xmlCharEncodingHandlerPtr)0x0;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    handler._4_4_ = enc;
    pxStack_18 = ctxt;
    code_00 = xmlLookupCharEncodingHandler(enc,(xmlCharEncodingHandler **)&code);
    if (code_00 == XML_ERR_OK) {
      ctxt_local._4_4_ = xmlSwitchToEncoding(pxStack_18,_code);
      if ((-1 < ctxt_local._4_4_) && (handler._4_4_ == XML_CHAR_ENCODING_NONE)) {
        pxStack_18->input->flags = pxStack_18->input->flags & 0xfffffffe;
      }
    }
    else {
      xmlFatalErr(pxStack_18,code_00,(char *)0x0);
      ctxt_local._4_4_ = -1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSwitchEncoding(xmlParserCtxtPtr ctxt, xmlCharEncoding enc)
{
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;
    xmlParserErrors code;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    code = xmlLookupCharEncodingHandler(enc, &handler);
    if (code != 0) {
        xmlFatalErr(ctxt, code, NULL);
        return(-1);
    }

    ret = xmlSwitchToEncoding(ctxt, handler);

    if ((ret >= 0) && (enc == XML_CHAR_ENCODING_NONE)) {
        ctxt->input->flags &= ~XML_INPUT_HAS_ENCODING;
    }

    return(ret);
}